

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O1

void __thiscall argparse::args_t::parse_match_mode(args_t *this,char *str)

{
  int iVar1;
  
  iVar1 = strcmp(str,"id");
  if (iVar1 == 0) {
    this->checks = id;
  }
  else {
    iVar1 = strcmp(str,"id_sequence");
    if (iVar1 == 0) {
      this->checks = id_and_sequence;
    }
    else {
      iVar1 = strcmp(str,"sequence");
      if (iVar1 != 0) {
        ERROR("invalid match mode: %s",str);
        return;
      }
      this->checks = sequence;
    }
  }
  return;
}

Assistant:

void args_t::parse_match_mode ( const char * str )
    {
        if (!strcmp (str, "id")) {
            checks = id;
        } else if (!strcmp (str, "id_sequence")) {
            checks = id_and_sequence;
        } else if (!strcmp (str, "sequence")) {
          checks = sequence;
        } else  {
            ERROR( "invalid match mode: %s", str );
        }
    }